

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O2

void __thiscall asl::Date::Date(Date *this,String *t)

{
  char *pcVar1;
  char cVar2;
  Date *pDVar3;
  byte bVar4;
  uint year;
  uint month;
  uint day;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int m;
  int s;
  uint uVar8;
  uint s_00;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  Map<asl::String,_int> *pMVar12;
  Zone z;
  anon_union_16_2_78e7fdac_for_String_2 *paVar13;
  char *pcVar14;
  char *pcVar15;
  double dVar16;
  double dVar17;
  long lVar18;
  Array<asl::String> parts;
  Array<asl::Map<asl::String,_int>::KeyVal> local_198 [2];
  Date *local_188;
  int local_180 [12];
  String local_150;
  String local_138;
  String local_120;
  String local_108;
  String local_f0;
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  dVar16 = nan((char *)this);
  this->_t = (double)SUB84(dVar16,0);
  paVar13 = &t->field_2;
  if (t->_size != 0) {
    paVar13 = (anon_union_16_2_78e7fdac_for_String_2 *)(t->field_2)._str;
  }
  local_188 = this;
  if ((byte)(paVar13->_space[0] + 0xbeU) < 0x18) {
    String::split((String *)&parts);
    if (5 < *(int *)&parts._a[-1].field_2) {
      if ((Date(asl::String_const&)::months == '\0') &&
         (iVar9 = __cxa_guard_acquire(&Date(asl::String_const&)::months), iVar9 != 0)) {
        String::String(&local_150,"Jan");
        local_180[0xb] = 1;
        Map<asl::String,_int>::Map((Map<asl::String,_int> *)local_198,&local_150,local_180 + 0xb);
        String::String(&local_48,"Feb");
        local_180[10] = 2;
        pMVar12 = Map<asl::String,_int>::set
                            ((Map<asl::String,_int> *)local_198,&local_48,local_180 + 10);
        String::String(&local_60,"Mar");
        local_180[9] = 3;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_60,local_180 + 9);
        String::String(&local_78,"Apr");
        local_180[8] = 4;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_78,local_180 + 8);
        String::String(&local_90,"May");
        local_180[7] = 5;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_90,local_180 + 7);
        String::String(&local_a8,"Jun");
        local_180[6] = 6;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_a8,local_180 + 6);
        String::String(&local_c0,"Jul");
        local_180[5] = 7;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_c0,local_180 + 5);
        String::String(&local_d8,"Aug");
        local_180[4] = 8;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_d8,local_180 + 4);
        String::String(&local_f0,"Sep");
        local_180[3] = 9;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_f0,local_180 + 3);
        String::String(&local_108,"Oct");
        local_180[2] = 10;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_108,local_180 + 2);
        String::String(&local_120,"Nov");
        local_180[1] = 0xb;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_120,local_180 + 1);
        String::String(&local_138,"Dec");
        local_180[0] = 0xc;
        pMVar12 = Map<asl::String,_int>::set(pMVar12,&local_138,local_180);
        Date::months.a._a = (Array<asl::Map<asl::String,_int>::KeyVal>)(pMVar12->a)._a;
        LOCK();
        ((KeyVal *)((long)Date::months.a._a + -0x20))->value =
             ((KeyVal *)((long)Date::months.a._a + -0x20))->value + 1;
        UNLOCK();
        String::~String(&local_138);
        String::~String(&local_120);
        String::~String(&local_108);
        String::~String(&local_f0);
        String::~String(&local_d8);
        String::~String(&local_c0);
        String::~String(&local_a8);
        String::~String(&local_90);
        String::~String(&local_78);
        String::~String(&local_60);
        String::~String(&local_48);
        Array<asl::Map<asl::String,_int>::KeyVal>::~Array(local_198);
        String::~String(&local_150);
        __cxa_atexit(Map<asl::String,_int>::~Map,&Date::months,&__dso_handle);
        __cxa_guard_release(&Date(asl::String_const&)::months);
      }
      local_150._size = 0;
      piVar10 = Map<asl::String,_int>::get(&Date::months,parts._a + 2,&local_150._size);
      if (parts._a[1]._size == 0) {
        paVar13 = &parts._a[1].field_2;
      }
      else {
        paVar13 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[1].field_2._str;
      }
      iVar9 = *piVar10;
      uVar5 = parseInt(paVar13->_space,2);
      if (parts._a[3]._size == 0) {
        paVar13 = &parts._a[3].field_2;
      }
      else {
        paVar13 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[3].field_2._str;
      }
      uVar6 = parseInt(paVar13->_space,parts._a[3]._len);
      if ((iVar9 != 0) && (-1 < (int)(uVar6 | uVar5))) {
        if (parts._a[4]._size == 0) {
          paVar13 = &parts._a[4].field_2;
        }
        else {
          paVar13 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[4].field_2._str;
        }
        if (((parts._a[4]._len == 8) && (paVar13->_space[2] == ':')) && (paVar13->_space[5] == ':'))
        {
          iVar7 = parseInt(paVar13->_space,2);
          m = parseInt(paVar13->_space + 3,2);
          s = parseInt(paVar13->_space + 6,2);
          construct(local_188,UTC,uVar6,iVar9,uVar5,iVar7,m,s);
        }
      }
    }
    Array<asl::String>::~Array(&parts);
    return;
  }
  uVar5 = t->_len;
  if ((int)uVar5 < 10) {
    uVar6 = 1;
    if ((int)uVar5 < 8) {
      return;
    }
  }
  else if ((paVar13->_space[4] == '-') && (paVar13->_space[7] == '-')) {
    uVar6 = 0;
  }
  else {
    uVar6 = 1;
  }
  year = parseInt(paVar13->_space,4);
  uVar11 = (ulong)(uVar6 ^ 5);
  month = parseInt(paVar13->_space + uVar11,2);
  bVar4 = (byte)uVar6;
  day = parseInt(paVar13->_space + (ulong)((uint)(bVar4 ^ 1) * 2) + 6,2);
  if (bVar4 == 0) {
    if (uVar5 < 0x10) {
      return;
    }
    if (paVar13->_space[10] != 'T') {
      return;
    }
    uVar8 = 0xb;
  }
  else {
    if (uVar5 < 0xd) {
      return;
    }
    if (paVar13->_space[8] != 'T') {
      return;
    }
    uVar8 = 9;
  }
  if ((int)(month | year | day) < 0) {
    return;
  }
  uVar5 = uVar5 - uVar8;
  dVar16 = 0.0;
  z = UTC;
  if (uVar5 < (uVar6 ^ 5)) {
    uVar6 = 0;
    uVar8 = 0;
    s_00 = 0;
    dVar17 = 0.0;
    goto LAB_00138be7;
  }
  pcVar14 = paVar13->_space + uVar8;
  if (bVar4 == 0) {
    if (pcVar14[2] != ':') {
      return;
    }
    local_198[1]._a = (KeyVal *)0x3;
    lVar18 = 6;
    if (uVar5 < 8) goto LAB_00138d48;
    uVar5 = (uint)(pcVar14[5] == ':');
  }
  else {
    local_198[1]._a = (KeyVal *)0x2;
    lVar18 = 4;
    if (uVar5 < 6) {
LAB_00138d48:
      uVar5 = 0;
    }
    else {
      uVar5 = (uint)((byte)(pcVar14[4] - 0x30U) < 10);
    }
  }
  uVar6 = parseInt(pcVar14,2);
  uVar8 = parseInt(pcVar14 + (long)local_198[1]._a,2);
  s_00 = parseInt(pcVar14 + lVar18,uVar5 * 2);
  if (uVar5 != 0) {
    uVar11 = (ulong)((uint)(bVar4 ^ 1) * 2 + 6);
  }
  pcVar15 = pcVar14 + uVar11;
  dVar17 = 0.0;
  if (pcVar14[uVar11] == '.') {
    iVar9 = -1;
    pcVar14 = pcVar15;
    do {
      pcVar1 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      iVar9 = iVar9 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
    iVar7 = parseInt(pcVar15 + 1,iVar9);
    dVar17 = pow(10.0,(double)-iVar9);
    dVar17 = dVar17 * (double)iVar7;
    pcVar15 = pcVar14;
  }
  z = UTC;
  if (0x17 < uVar6) {
    return;
  }
  if (0x3b < uVar8) {
    return;
  }
  if (0x3b < s_00) {
    return;
  }
  dVar16 = 0.0;
  if (dVar17 < 0.0) {
    return;
  }
  cVar2 = *pcVar15;
  if (cVar2 == '\0') {
    z = LOCAL;
  }
  else {
    if (cVar2 != '+') {
      if (cVar2 == 'Z') goto LAB_00138be7;
      if (cVar2 != '-') {
        return;
      }
    }
    iVar9 = (int)&t->field_2;
    if (t->_size != 0) {
      iVar9 = *(int *)&t->field_2;
    }
    iVar7 = (iVar9 + t->_len) - (int)pcVar15;
    iVar9 = 0;
    if (2 < iVar7) {
      iVar9 = parseInt(pcVar15 + 1,2);
      iVar9 = iVar9 * 0x3c;
    }
    if (iVar7 != 3) {
      if (iVar7 == 5) {
        lVar18 = 3;
      }
      else {
        if (iVar7 != 6) {
          return;
        }
        if (pcVar15[3] != ':') {
          return;
        }
        lVar18 = 4;
      }
      iVar7 = parseInt(pcVar15 + lVar18,2);
      iVar9 = iVar9 + iVar7;
    }
    if (iVar9 < -100000) {
      return;
    }
    iVar7 = -iVar9;
    if (cVar2 != '+') {
      iVar7 = iVar9;
    }
    dVar16 = (double)(iVar7 * 0x3c);
    z = UTC;
  }
LAB_00138be7:
  pDVar3 = local_188;
  construct(local_188,z,year,month,day,uVar6,uVar8,s_00);
  pDVar3->_t = dVar16 + dVar17 + pDVar3->_t;
  return;
}

Assistant:

Date::Date(const String& t)
{
	_t = nan();
	if (t[0] > 'A' && t[0] < 'Z') // HTTP like? "Thu, 18 May 2017 03:24:12 GMT"
	{
		Array<String> parts = t.split();
		if (parts.length() < 6)
			return;
		
		static Map<String, int> months = Map<String, int>("Jan", 1)("Feb", 2)(
		    "Mar", 3)("Apr", 4)("May", 5)("Jun", 6)("Jul", 7)("Aug", 8)("Sep", 9)("Oct", 10)("Nov", 11)("Dec", 12);
		
		int mo = months.get(parts[2], 0);
		int d = parseInt(parts[1], 2);
		int y = parseInt(parts[3], parts[3].length());
		if (mo == 0 || y < 0 || d < 0)
			return;
		const char* time = parts[4];
		if (parts[4].length() != 8 || time[2] != ':' || time[5] != ':')
			return;
		int h = parseInt(time, 2);
		int m = parseInt(time + 3, 2);
		int s = parseInt(time + 6, 2);
		construct(UTC, y, mo, d, h, m, s);
		return;
	}
	const char* p = t.data();
	int         y = -1, m = 1, d = 1;
	int         iTime = 0;
	bool        basic = true, local = false, hassecs = false;

	if (t.length() >= 10 && p[4] == '-' && p[7] == '-')
	{
		basic = false;
	}
	else if (t.length() < 8)
		return;

	y = parseInt(p + 0, 4);
	m = parseInt(p + (basic ? 4 : 5), 2);
	d = parseInt(p + (basic ? 6 : 8), 2);

	if (basic && t.length() > 12 && t[8] == 'T')
		iTime = 9;
	else if (!basic && t.length() > 15 && t[10] == 'T')
		iTime = 11;
	else
		return;

	if (y < 0 || m < 0 || d < 0)
		return;

	int    h = 0, mi = 0, s = 0, tz = 0;
	double ms = 0;

	if (iTime > 0)
		p = p + iTime;

	if (iTime > 0 && t.length() - iTime >= (basic ? 4 : 5)) // there is time
	{
		if (!basic) // ext
		{
			if (p[2] != ':')
				return;
			if (t.length() - iTime >= 8 && p[5] == ':')
				hassecs = true;
		}
		else // basic
		{
			if (t.length() - iTime >= 6 && myisdigit(p[4]))
				hassecs = true;
		}

		h = parseInt(p, 2);
		mi = parseInt(p + (basic ? 2 : 3), 2);
		s = parseInt(p + (basic ? 4 : 6), hassecs ? 2 : 0);
		p += hassecs ? (basic ? 6 : 8) : (basic ? 4 : 5);

		if (p[0] == '.') // have ms
		{
			int i = 1;
			while (myisdigit(p[i]))
				i++;
			ms = parseInt(p + 1, i - 1) * pow(10.0, 1-i);
			p += i;
		}

		if (h < 0 || h > 23 || mi < 0 || mi > 59 || s < 0 || s > 59 || ms < 0)
			return;

		if (p[0] == 'Z')
			tz = 0;
		else if (p[0] == '+' || p[0] == '-')
		{
			int n = int(t.data() + t.length() - p);
			if (n >= 3)
				tz = parseInt(p + 1, 2) * 60;
			if (n == 6 && p[3] == ':')
				tz += parseInt(p + 4, 2);
			else if (n == 5)
				tz += parseInt(p + 3, 2);
			else if (n != 3)
				tz = -1000000;

			if (tz < -100000)
				return;

			if (p[0] == '+')
				tz = -tz;
		}
		else if (p[0] == '\0')
			local = true;
		else
			return;
	}

	construct(local ? LOCAL : UTC, y, m, d, h, mi, s);

	_t += tz * 60 + ms;
}